

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_factory.cpp
# Opt level: O1

unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> __thiscall
n_e_s::core::RomFactory::from_bytes(RomFactory *this,istream *bytestream)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer puVar7;
  size_type __n;
  long *plVar8;
  invalid_argument *piVar9;
  logic_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  ulong uVar10;
  string_view fmt;
  format_args args;
  INesHeader h;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chr_memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prg_rom;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  pointer puStack_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ulong local_48 [3];
  
  std::istream::seekg((long)bytestream,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg((long)bytestream,_S_beg);
  if ((long)__n < 0) {
    __assert_fail("size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/rom_factory.cpp"
                  ,0x1b,"size_t (anonymous namespace)::streamsize(std::istream &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,__n,(allocator_type *)(local_c8 + 0x10));
  if ((ulong)((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 0x10) {
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar9,"File isn\'t big enough to contain a header");
  }
  else {
    plVar8 = (long *)std::istream::read((char *)bytestream,
                                        (long)local_78.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
      local_c8._0_4_ = 0x1a53454e;
      local_c8._11_4_ = 0;
      local_c8[0xf] = 0;
      if (*(int *)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != 0x1a53454e) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar9,"No valid iNes header");
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_c8._0_4_ =
           *(undefined4 *)
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      uVar2 = *(uint *)((long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4);
      iVar3 = *(int *)((long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 8);
      local_c8[8] = (char)iVar3;
      local_c8._9_2_ = (undefined2)((uint)iVar3 >> 8);
      local_c8._12_3_ =
           (undefined3)
           *(int *)((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0xc);
      local_c8._11_4_ = CONCAT31(local_c8._12_3_,(char)((uint)iVar3 >> 0x18));
      local_c8[0xf] =
           (undefined1)
           ((uint)*(int *)((long)local_78.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0xc) >> 0x18);
      if (local_c8[8] == '\0') {
        local_c8[8] = '\x01';
      }
      local_c8[4] = (byte)uVar2;
      uVar10 = (ulong)local_c8[4];
      local_c8[5] = (byte)(uVar2 >> 8);
      uVar1 = (ulong)local_c8[5];
      local_c8._4_4_ = uVar2;
      if ((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == uVar10 * 0x4000 + uVar1 * 0x2000 + 0x10) {
        local_c8[6] = (byte)(uVar2 >> 0x10);
        bVar4 = local_c8[6];
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_60,
                   (uchar *)((long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x10),
                   (uchar *)((long)local_78.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            (uVar10 * 0x1000 + 4) * 4),(allocator_type *)(local_c8 + 0x10));
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_c8[5] == '\0') {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_98,0x2000);
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_c8 + 0x10),
                     (uchar *)((long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              (uVar10 * 0x1000 + 4) * 4),
                     (uchar *)((long)local_78.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              (uVar10 * 0x1000 + uVar1 * 0x800 + 4) * 4),(allocator_type *)local_48)
          ;
          puVar7 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar6 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
          local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
          local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puStack_a8;
          local_b8._0_8_ = (pointer)0x0;
          local_b8._8_8_ = (pointer)0x0;
          puStack_a8 = (pointer)0x0;
          if (puVar6 != (pointer)0x0) {
            operator_delete(puVar6,(long)puVar7 - (long)puVar6);
          }
          if ((pointer)local_b8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_b8._0_8_,(long)puStack_a8 - local_b8._0_8_);
          }
        }
        uVar10 = (ulong)(uVar2 >> 0x18 & 0xf0) | (ulong)(bVar4 >> 4);
        if ((char)uVar10 == '\x02') {
          std::
          make_unique<n_e_s::core::Mapper2,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((INesHeader *)(local_c8 + 0x10),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&local_60);
        }
        else {
          if ((uVar2 & 0xf0000000) != 0 || bVar4 >> 4 != 0) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            fmt.size_ = 2;
            fmt.data_ = (char *)0x16;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_48;
            local_48[0] = uVar10;
            ::fmt::v8::vformat_abi_cxx11_
                      ((string *)(local_c8 + 0x10),(v8 *)"Unsupported mapper: {}",fmt,args);
            std::logic_error::logic_error(this_00,(string *)(local_c8 + 0x10));
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          std::
          make_unique<n_e_s::core::Nrom,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((INesHeader *)(local_c8 + 0x10),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&local_60);
        }
        uVar5 = local_b8._0_8_;
        local_b8._0_8_ = (pointer)0x0;
        *(undefined8 *)this = uVar5;
        if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((int *)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (int *)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return (__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>
                )(__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>
                  )this;
      }
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar9,"Unexpected rom size");
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar9,"Unable to get bytes");
  }
  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<IRom> RomFactory::from_bytes(std::istream &bytestream) {
    std::vector<uint8_t> bytes(streamsize(bytestream));
    if (bytes.size() < 16) {
        throw std::invalid_argument(
                "File isn't big enough to contain a header");
    }

    if (!bytestream.read(reinterpret_cast<char *>(&bytes[0]), bytes.size())) {
        throw std::invalid_argument("Unable to get bytes");
    }

    INesHeader h;
    if (!std::equal(bytes.begin(), bytes.begin() + sizeof(h.nes), h.nes)) {
        throw std::invalid_argument("No valid iNes header");
    }

    // This is fine because the header is exactly 16 bytes with no padding.
    memcpy(&h, &bytes[0], sizeof(h));
    if (h.prg_ram_size == 0) {
        h.prg_ram_size = 1; // For compatibility reasons, 0 ram means 1 ram.
    }

    uint8_t mapper = static_cast<uint8_t>(h.flags_6 & 0xF0u) >> 4u;
    mapper |= h.flags_7 & 0xF0u;

    const auto prg_rom_byte_count =
            static_cast<uint32_t>(h.prg_rom_size * 16 * 1024);
    const auto chr_rom_byte_count =
            static_cast<uint32_t>(h.chr_rom_size * 8 * 1024);

    const uint32_t expected_rom_size =
            sizeof(INesHeader) + prg_rom_byte_count + chr_rom_byte_count;
    if (bytes.size() != expected_rom_size) {
        throw std::invalid_argument("Unexpected rom size");
    }

    std::vector<uint8_t> prg_rom(bytes.begin() + sizeof(INesHeader),
            bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count);

    std::vector<uint8_t> chr_memory;
    if (h.chr_rom_size == 0) {
        // No chr rom, game uses chr ram
        // Allocate ram with enough size:
        // https://www.nesdev.org/wiki/CHR_ROM_vs._CHR_RAM
        chr_memory.resize(static_cast<std::size_t>(8u * 1024u));
    } else {
        chr_memory = std::vector<uint8_t>(
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count,
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count +
                        chr_rom_byte_count);
    }

    if (mapper == 0) {
        return std::make_unique<Nrom>(h, prg_rom, chr_memory);
    }
    if (mapper == 2) {
        return std::make_unique<Mapper2>(h, prg_rom, chr_memory);
    }

    throw std::logic_error(fmt::format("Unsupported mapper: {}", mapper));
}